

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

IVec4 __thiscall
tcu::ConstPixelBufferAccess::getPixelInt(ConstPixelBufferAccess *this,int x,int y,int z)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined2 uVar4;
  Channel CVar5;
  ushort uVar6;
  ChannelOrder CVar7;
  uint uVar8;
  int iVar9;
  ChannelOrder CVar10;
  TextureSwizzle *pTVar11;
  ChannelType CVar12;
  ChannelOrder CVar13;
  ulong uVar14;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  Vector<int,_4> *res;
  undefined4 in_register_00000034;
  ChannelOrder *pCVar15;
  ChannelOrder CVar16;
  int in_R8D;
  int c;
  long lVar17;
  ChannelOrder *pCVar18;
  IVec4 IVar19;
  IVec4 result;
  TextureFormat local_48;
  undefined8 uStack_40;
  
  pCVar15 = (ChannelOrder *)CONCAT44(in_register_00000034,x);
  uVar14 = (ulong)(y * pCVar15[5]);
  pCVar18 = (ChannelOrder *)
            ((long)(int)(in_R8D * pCVar15[7]) + (long)(int)(z * pCVar15[6]) +
            (long)(int)(y * pCVar15[5]) + *(undefined8 *)(pCVar15 + 8));
  local_48.order = R;
  local_48.type = SNORM_INT8;
  uStack_40 = 0;
  CVar10 = pCVar15[1];
  switch(CVar10) {
  case L:
    switch(*pCVar15) {
    case RGB:
    case sRGB:
      bVar1 = *(byte *)((long)pCVar18 + 1);
      bVar2 = *(byte *)((long)pCVar18 + 2);
      uVar14 = (ulong)bVar2;
      (this->m_format).order = (uint)(byte)(char)*pCVar18;
      (this->m_format).type = (uint)bVar1;
      (this->m_size).m_data[0] = (uint)bVar2;
      break;
    case RGBA:
    case sRGBA:
      bVar1 = *(byte *)((long)pCVar18 + 1);
      bVar2 = *(byte *)((long)pCVar18 + 2);
      uVar14 = (ulong)bVar2;
      bVar3 = *(byte *)((long)pCVar18 + 3);
      (this->m_format).order = (uint)(byte)(char)*pCVar18;
      (this->m_format).type = (uint)bVar1;
      (this->m_size).m_data[0] = (uint)bVar2;
      (this->m_size).m_data[1] = (uint)bVar3;
      goto LAB_00154079;
    default:
      switch(CVar10) {
      case RGB:
      case sBGR:
        goto switchD_00153e79_caseD_7;
      case RGBA:
      case sBGRA:
        goto switchD_00153e79_caseD_8;
      case ARGB:
        goto switchD_00153e79_caseD_9;
      case BGR:
      case D:
        goto switchD_00153e79_caseD_a;
      case BGRA:
      case S:
        goto switchD_00153e79_caseD_b;
      case sR:
        goto switchD_00153e79_caseD_c;
      case sRG:
        goto switchD_00153e79_caseD_d;
      case sRGB:
      case DS:
        goto switchD_00153e79_caseD_e;
      case sRGBA:
      case CHANNELORDER_LAST:
        goto switchD_00153e79_caseD_f;
      default:
        goto switchD_00153e79_caseD_4;
      }
    }
    goto LAB_00154072;
  default:
switchD_00153e79_caseD_4:
    pTVar11 = getChannelReadSwizzle(*pCVar15);
    iVar9 = getChannelSize(CVar10);
    lVar17 = 0;
    uVar14 = extraout_RDX;
    do {
      CVar5 = pTVar11->components[lVar17];
      if (CVar5 < CHANNEL_ZERO) {
        CVar10 = anon_unknown_74::channelToInt
                           ((byte *)((long)(int)(CVar5 * iVar9) + (long)pCVar18),pCVar15[1]);
        uVar14 = extraout_RDX_00;
LAB_001540e8:
        (&local_48.order)[lVar17] = CVar10;
      }
      else {
        CVar10 = R;
        if (CVar5 == CHANNEL_ZERO) goto LAB_001540e8;
        if (CVar5 == CHANNEL_ONE) {
          CVar10 = A;
          goto LAB_001540e8;
        }
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != 4);
    this->m_format = local_48;
    *(undefined8 *)(this->m_size).m_data = uStack_40;
    goto LAB_00154079;
  case RGB:
  case sBGR:
switchD_00153e79_caseD_7:
    CVar10 = *pCVar18;
    (this->m_format).order = (uint)((byte)(char)CVar10 >> 4);
    (this->m_format).type = (byte)(char)CVar10 & UNORM_INT_1010102_REV;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 1;
    goto LAB_00154079;
  case RGBA:
  case sBGRA:
switchD_00153e79_caseD_8:
    uVar4 = (undefined2)*pCVar18;
    CVar7 = (ChannelOrder)((ushort)uVar4 >> 0xb);
    CVar12 = (ushort)uVar4 >> 5 & (UNSIGNED_INT24|UNSIGNED_INT16);
    break;
  case ARGB:
switchD_00153e79_caseD_9:
    uVar4 = (undefined2)*pCVar18;
    CVar7 = (ushort)uVar4 >> 10 & (sBGR|sRGBA);
    CVar12 = (ushort)uVar4 >> 5 & UNSIGNED_INT16;
    break;
  case BGR:
  case D:
switchD_00153e79_caseD_a:
    uVar4 = (undefined2)*pCVar18;
    uVar6 = (ushort)uVar4 >> 0xc;
    CVar12 = (ushort)uVar4 >> 8 & UNORM_INT_1010102_REV;
    CVar10 = (ushort)uVar4 >> 4 & sRGBA;
    uVar8 = (ushort)uVar4 & 0xf;
    goto LAB_00153fc8;
  case BGRA:
  case S:
switchD_00153e79_caseD_b:
    uVar4 = (undefined2)*pCVar18;
    uVar6 = (ushort)uVar4 >> 0xb;
    CVar12 = (ushort)uVar4 >> 6 & UNSIGNED_INT16;
    CVar10 = (ushort)uVar4 >> 1 & (sBGR|sRGBA);
    uVar8 = (ushort)uVar4 & 1;
LAB_00153fc8:
    uVar14 = (ulong)CVar12;
    if (*pCVar15 == RGBA) {
      (this->m_format).order = (uint)uVar6;
      (this->m_format).type = CVar12;
      (this->m_size).m_data[0] = CVar10;
    }
    else {
      (this->m_format).order = CVar10;
      (this->m_format).type = CVar12;
      (this->m_size).m_data[0] = (uint)uVar6;
    }
LAB_00154014:
    (this->m_size).m_data[1] = uVar8;
    goto LAB_00154079;
  case sR:
switchD_00153e79_caseD_c:
    uVar4 = (undefined2)*pCVar18;
    CVar10 = (ushort)uVar4 >> 10 & (sBGR|sRGBA);
    uVar14 = (ulong)CVar10;
    (this->m_format).order = CVar10;
    (this->m_format).type = (ushort)uVar4 >> 5 & UNSIGNED_INT16;
    (this->m_size).m_data[0] = (ushort)uVar4 & 0x1f;
    (this->m_size).m_data[1] = (uint)((ushort)uVar4 >> 0xf);
    goto LAB_00154079;
  case sRG:
switchD_00153e79_caseD_d:
    CVar10 = *pCVar18;
    CVar7 = CVar10 >> 0x16;
    uVar14 = (ulong)(CVar10 >> 0xc & 0x3ff);
    CVar10 = CVar10 >> 2 & 0x3ff;
    goto LAB_00154060;
  case sRGB:
  case DS:
switchD_00153e79_caseD_e:
    CVar10 = *pCVar18;
    CVar7 = -(CVar10 & 0x200) | CVar10 & 0x3ff;
    CVar12 = -(CVar10 >> 10 & 0x200) | CVar10 >> 10 & 0x3ff;
    uVar14 = (ulong)CVar12;
    CVar13 = -(CVar10 >> 0x14 & 0x200) | CVar10 >> 0x14 & 0x3ff;
    if (*pCVar15 == RGBA) {
      (this->m_format).order = CVar7;
      (this->m_format).type = CVar12;
      (this->m_size).m_data[0] = CVar13;
    }
    else {
      (this->m_format).order = CVar13;
      (this->m_format).type = CVar12;
      (this->m_size).m_data[0] = CVar7;
    }
    (this->m_size).m_data[1] = -(CVar10 >> 0x1e & 0xfffffffe) | CVar10 >> 0x1e;
    goto LAB_00154079;
  case sRGBA:
  case CHANNELORDER_LAST:
switchD_00153e79_caseD_f:
    CVar10 = *pCVar18;
    CVar13 = CVar10 & 0x3ff;
    uVar14 = (ulong)CVar13;
    CVar16 = CVar10 >> 0x14 & 0x3ff;
    uVar8 = CVar10 >> 0x1e;
    CVar7 = CVar16;
    if (*pCVar15 != RGBA) {
      CVar7 = CVar13;
      CVar13 = CVar16;
    }
    (this->m_format).order = CVar13;
    (this->m_format).type = CVar10 >> 10 & 0x3ff;
    (this->m_size).m_data[0] = CVar7;
    goto LAB_00154014;
  }
  uVar14 = (ulong)CVar12;
  CVar10 = (ushort)uVar4 & (sBGR|sRGBA);
  if (*pCVar15 == RGB) {
LAB_00154060:
    (this->m_format).order = CVar7;
    (this->m_format).type = (ChannelType)uVar14;
    (this->m_size).m_data[0] = CVar10;
  }
  else {
    (this->m_format).order = CVar10;
    (this->m_format).type = CVar12;
    (this->m_size).m_data[0] = CVar7;
  }
LAB_00154072:
  (this->m_size).m_data[1] = 1;
LAB_00154079:
  IVar19.m_data[2] = (int)uVar14;
  IVar19.m_data[3] = (int)(uVar14 >> 0x20);
  IVar19.m_data._0_8_ = this;
  return (IVec4)IVar19.m_data;
}

Assistant:

IVec4 ConstPixelBufferAccess::getPixelInt (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* const	pixelPtr = (const deUint8*)getPixelPtr(x, y, z);
	IVec4					result;

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Int(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Int(pixelPtr);
	}

#define U8(OFFS, COUNT)			((*((const deUint8* )pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define S32(OFFS, COUNT)		signExtend(U32(OFFS, COUNT), (COUNT))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:			// Fall-through
		case TextureFormat::UNORM_BYTE_44:				return			 UVec4(U8 ( 4,  4), U8 ( 0,  4), 0u, 1u).cast<int>();
		case TextureFormat::UNSIGNED_SHORT_565:			// Fall-through
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB(UVec4(U16(11,  5), U16( 5,  6), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB(UVec4(U16(10,  5), U16( 5,  5), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_4444:		// Fall-through
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB(UVec4(U16(12,  4), U16( 8,  4), U16( 4,  4), U16( 0, 4)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		// Fall-through
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB(UVec4(U16(11,  5), U16( 6,  5), U16( 1,  5), U16( 0, 1)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNORM_INT_101010:			return			 UVec4(U32(22, 10), U32(12, 10), U32( 2, 10), 1).cast<int>();
		case TextureFormat::UNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB(UVec4(U32( 0, 10), U32(10, 10), U32(20, 10), U32(30, 2)), m_format.order, TextureFormat::RGBA).cast<int>();
		case TextureFormat::SNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB(IVec4(S32( 0, 10), S32(10, 10), S32(20, 10), S32(30, 2)), m_format.order, TextureFormat::RGBA);

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return UVec4(U16(15, 1), U16(10, 5), U16(5, 5), U16(0, 5)).cast<int>().swizzle(1,2,3,0); // ARGB -> RGBA

		default:
			break; // To generic path.
	}

#undef U8
#undef U16
#undef U32
#undef S32

	// Generic path.
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToInt(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}